

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat32 *
fetchARGBPMToRGBA32F<(QImage::Format)18>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  QRgbaFloat<float> QVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)count;
  if (count < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 4 != uVar3; uVar3 = uVar3 + 4) {
    uVar1 = *(uint *)(src + uVar3 + (long)index * 4);
    QVar4 = QRgbaFloat<float>::fromArgb32
                      (uVar1 & 0xff00ff00 | (uVar1 & 0xff) << 0x10 | uVar1 >> 0x10 & 0xff);
    *(QRgbaFloat<float> *)(&buffer->r + uVar3) = QVar4;
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBPMToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                        const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i));
    return buffer;
}